

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateRepeatedPrimitiveHelperMethods
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field,
          bool untyped)

{
  FieldDescriptor *this_00;
  GeneratorOptions *options_00;
  char *pcVar1;
  OneofDescriptor *pOVar2;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  BytesMode bytes_mode;
  undefined1 in_R9B;
  allocator local_179;
  string local_178;
  byte local_153;
  allocator local_152;
  byte local_151;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_70;
  string local_50;
  byte local_29;
  GeneratorOptions *pGStack_28;
  bool untyped_local;
  FieldDescriptor *field_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_29 = untyped;
  pGStack_28 = (GeneratorOptions *)field;
  field_local = (FieldDescriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  options_00 = (GeneratorOptions *)FieldDescriptor::containing_type(field);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)options,options_00,(Descriptor *)field);
  bytes_mode = BYTES_B64;
  (anonymous_namespace)::JSGetterName_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)printer_local,pGStack_28,(FieldDescriptor *)0x0,
             BYTES_B64,(bool)in_R9B);
  (anonymous_namespace)::JSTypeName_abi_cxx11_
            (&local_a0,(_anonymous_namespace_ *)printer_local,pGStack_28,(FieldDescriptor *)0x0,
             bytes_mode);
  (anonymous_namespace)::JSFieldIndex_abi_cxx11_
            (&local_c0,(_anonymous_namespace_ *)pGStack_28,field_01);
  io::Printer::Print(printer,
                     "/**\n * @param {!$optionaltype$} value\n * @param {number=} opt_index\n */\n$class$.prototype.add$name$ = function(value, opt_index) {\n  jspb.Message.addToRepeatedField(this, $index$"
                     ,"class",&local_50,"name",&local_70,"optionaltype",&local_a0,"index",&local_c0)
  ;
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = field_local;
  pcVar1 = "";
  if ((local_29 & 1) != 0) {
    pcVar1 = "/** @type{string|number|boolean|!Uint8Array} */(";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,pcVar1,&local_e1);
  field_00 = (FieldDescriptor *)0x5d10d1;
  pcVar1 = "";
  if ((local_29 & 1) != 0) {
    pcVar1 = ")";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,pcVar1,&local_109);
  local_151 = 0;
  local_153 = 0;
  pOVar2 = FieldDescriptor::containing_oneof((FieldDescriptor *)pGStack_28);
  if (pOVar2 == (OneofDescriptor *)0x0) {
    std::allocator<char>::allocator();
    local_153 = 1;
    std::__cxx11::string::string((string *)&local_130,"",&local_152);
  }
  else {
    (anonymous_namespace)::JSOneofArray_abi_cxx11_
              (&local_150,(_anonymous_namespace_ *)printer_local,pGStack_28,field_00);
    local_151 = 1;
    std::operator+(&local_130,", ",&local_150);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"",&local_179);
  io::Printer::Print((Printer *)this_00,
                     "$oneofgroup$, $type$value$rptvalueinit$$typeclose$, opt_index);\n};\n\n\n",
                     "type",&local_e0,"typeclose",&local_108,"oneofgroup",&local_130,"rptvalueinit",
                     &local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string((string *)&local_130);
  if ((local_153 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_152);
  }
  if ((local_151 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_150);
  }
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return;
}

Assistant:

void Generator::GenerateRepeatedPrimitiveHelperMethods(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field, bool untyped) const {
  printer->Print(
      "/**\n"
      " * @param {!$optionaltype$} value\n"
      " * @param {number=} opt_index\n"
      " */\n"
      "$class$.prototype.add$name$ = function(value, opt_index) {\n"
      "  jspb.Message.addToRepeatedField(this, $index$",
      "class", GetMessagePath(options, field->containing_type()),
      "name", JSGetterName(options, field, BYTES_DEFAULT,
                   /* drop_list = */ true),
      "optionaltype", JSTypeName(options, field, BYTES_DEFAULT), "index",
      JSFieldIndex(field));
  printer->Print(
      "$oneofgroup$, $type$value$rptvalueinit$$typeclose$, opt_index);\n"
      "};\n"
      "\n"
      "\n",
      "type", untyped ? "/** @type{string|number|boolean|!Uint8Array} */(" : "",
      "typeclose", untyped ? ")" : "", "oneofgroup",
      (field->containing_oneof() ? (", " + JSOneofArray(options, field)) : ""),
      "rptvalueinit", "");
}